

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumMTSetups(void *arkode_mem,long *nmtsetups)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMTSetups",&local_10,&local_18);
  if (iVar1 == 0) {
    *nmtsetups = local_18->nmtsetup;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMTSetups(void *arkode_mem, long int *nmtsetups)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMTSetups",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmtsetups = arkls_mem->nmtsetup;
  return(ARKLS_SUCCESS);
}